

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UnaryFunctionLayerParams::SerializeWithCachedSizes
          (UnaryFunctionLayerParams *this,CodedOutputStream *output)

{
  UnaryFunctionLayerParams_Operation UVar1;
  float fVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  UnaryFunctionLayerParams *this_local;
  
  UVar1 = type(this);
  if (UVar1 != UnaryFunctionLayerParams_Operation_SQRT) {
    UVar1 = type(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,UVar1,output);
  }
  fVar2 = alpha(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = alpha(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar2,output);
  }
  fVar2 = epsilon(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = epsilon(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar2,output);
  }
  fVar2 = shift(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = shift(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(4,fVar2,output);
  }
  fVar2 = scale(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = scale(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(5,fVar2,output);
  }
  return;
}

Assistant:

void UnaryFunctionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.UnaryFunctionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.UnaryFunctionLayerParams.Operation type = 1;
  if (this->type() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->type(), output);
  }

  // float alpha = 2;
  if (this->alpha() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->alpha(), output);
  }

  // float epsilon = 3;
  if (this->epsilon() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->epsilon(), output);
  }

  // float shift = 4;
  if (this->shift() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(4, this->shift(), output);
  }

  // float scale = 5;
  if (this->scale() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->scale(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.UnaryFunctionLayerParams)
}